

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::GetItemFromArrayPrototype
               (JavascriptArray *arr,int32 indexInt,Var *result,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  JavascriptArray *this;
  DynamicObject *obj;
  DynamicObject *pDVar8;
  BOOL BVar9;
  
  pRVar6 = RecyclableObject::GetPrototype((RecyclableObject *)arr);
  if (pRVar6 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00aad67e;
    *puVar7 = 0;
  }
  TVar1 = ((pRVar6->type).ptr)->typeId;
  if ((int)TVar1 < 0x58) {
    BVar9 = 0;
    if (TVar1 == TypeIds_Array) {
      this = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(pRVar6);
      if (((this->super_ArrayObject).length != 0) &&
         (iVar4 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x26])
                            (this,this,(ulong)(uint)indexInt,result,scriptContext), iVar4 == 1)) {
        return 1;
      }
      obj = (DynamicObject *)RecyclableObject::GetPrototype((RecyclableObject *)this);
      pDVar8 = JavascriptLibraryBase::GetObjectPrototype
                         (&((((((((obj->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                              super_JavascriptLibraryBase).scriptContext.ptr)->
                            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
                         );
      BVar9 = 0;
      if (pDVar8 == obj) {
        pDVar8 = VarTo<Js::DynamicObject,Js::RecyclableObject>((RecyclableObject *)obj);
        bVar3 = DynamicObject::HasNonEmptyObjectArray(pDVar8);
        if ((bVar3) &&
           (iVar4 = (*(obj->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x26])
                              (obj,arr,(ulong)(uint)indexInt,result,scriptContext), iVar4 == 1)) {
          return 1;
        }
        pRVar6 = ScriptContext::GetMissingItemResult(scriptContext);
        *result = pRVar6;
        BVar9 = 1;
      }
    }
  }
  else {
    BVar5 = RecyclableObject::IsExternal(pRVar6);
    BVar9 = 0;
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_00aad67e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
  }
  return BVar9;
}

Assistant:

BOOL JavascriptOperators::GetItemFromArrayPrototype(JavascriptArray * arr, int32 indexInt, Var * result, ScriptContext * scriptContext)
    {
        // try get from Array prototype
        RecyclableObject* prototype = arr->GetPrototype();
        if (JavascriptOperators::GetTypeId(prototype) != TypeIds_Array) //This can be TypeIds_ES5Array (or any other object changed through __proto__).
        {
            return false;
        }

        JavascriptArray* arrayPrototype = UnsafeVarTo<JavascriptArray>(prototype); //Prototype must be Array.prototype (unless changed through __proto__)
        if (arrayPrototype->GetLength() && arrayPrototype->GetItem(arrayPrototype, (uint32)indexInt, result, scriptContext))
        {
            return true;
        }

        prototype = arrayPrototype->GetPrototype(); //Its prototype must be Object.prototype (unless changed through __proto__)
        if (prototype->GetScriptContext()->GetLibrary()->GetObjectPrototype() != prototype)
        {
            return false;
        }

        if (VarTo<DynamicObject>(prototype)->HasNonEmptyObjectArray())
        {
            if (prototype->GetItem(arr, (uint32)indexInt, result, scriptContext))
            {
                return true;
            }
        }

        *result = scriptContext->GetMissingItemResult();
        return true;
    }